

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

int Gia_ManSimBitPackOne
              (int nWords,Vec_Wrd_t *vSimsIn,Vec_Wrd_t *vSimsCare,int iPat,int *pLits,int nLits)

{
  word *pwVar1;
  word *pwVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong local_40;
  
  if (iPat < 1) {
    local_40 = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar9 = 0;
      local_40 = uVar6;
      if (0 < nLits) {
        bVar3 = (byte)uVar6 & 0x3f;
        uVar9 = 0;
        while( true ) {
          uVar5 = pLits[uVar9];
          if ((int)uVar5 < 0) goto LAB_007d242e;
          uVar4 = (uVar5 >> 1) * nWords;
          if ((((int)uVar4 < 0) || (vSimsIn->nSize <= (int)uVar4)) ||
             (vSimsCare->nSize <= (int)uVar4)) goto LAB_007d240f;
          if (((vSimsCare->pArray[(ulong)uVar4 + (uVar6 >> 6)] & 1L << bVar3) != 0) &&
             (((uVar5 ^ (uint)(vSimsIn->pArray[(ulong)uVar4 + (uVar6 >> 6)] >> bVar3)) & 1) == 0))
          break;
          uVar9 = uVar9 + 1;
          if ((uint)nLits == uVar9) goto LAB_007d2326;
        }
      }
    } while (((int)uVar9 != nLits) &&
            (uVar5 = (int)uVar6 + 1, uVar6 = (ulong)uVar5, local_40 = (ulong)(uint)iPat,
            uVar5 != iPat));
  }
LAB_007d2326:
  if (0 < nLits) {
    uVar6 = local_40 >> 6;
    bVar3 = (byte)local_40 & 0x3f;
    uVar9 = 1L << bVar3;
    uVar10 = 0;
    do {
      uVar5 = pLits[uVar10];
      if ((int)uVar5 < 0) {
LAB_007d242e:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar4 = (uVar5 >> 1) * nWords;
      if ((((int)uVar4 < 0) || (vSimsIn->nSize <= (int)uVar4)) || (vSimsCare->nSize <= (int)uVar4))
      {
LAB_007d240f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      uVar8 = (ulong)uVar4;
      lVar11 = uVar8 * 8;
      pwVar1 = vSimsIn->pArray;
      pwVar2 = vSimsCare->pArray;
      uVar7 = pwVar2[uVar8 + uVar6];
      if (((uVar7 & uVar9) == 0) && ((((uint)(pwVar1[uVar8 + uVar6] >> bVar3) ^ uVar5) & 1) == 0)) {
        uVar7 = (ulong)(uint)((int)uVar6 * 8);
        *(word *)((long)pwVar1 + uVar7 + lVar11) = pwVar1[uVar8 + uVar6] ^ uVar9;
        uVar7 = *(ulong *)((long)pwVar2 + uVar7 + lVar11);
      }
      uVar8 = (ulong)(uint)((int)uVar6 * 8);
      *(ulong *)((long)pwVar2 + uVar8 + lVar11) = uVar7 | uVar9;
      if (((uVar5 ^ (uint)(*(ulong *)((long)pwVar1 + uVar8 + lVar11) >> bVar3)) & 1) == 0) {
        __assert_fail("Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k]))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                      ,0x130,
                      "int Gia_ManSimBitPackOne(int, Vec_Wrd_t *, Vec_Wrd_t *, int, int *, int)");
      }
      uVar10 = uVar10 + 1;
    } while ((uint)nLits != uVar10);
  }
  return (int)((int)local_40 == iPat);
}

Assistant:

int Gia_ManSimBitPackOne( int nWords, Vec_Wrd_t * vSimsIn, Vec_Wrd_t * vSimsCare, int iPat, int * pLits, int nLits )
{
    word * pSimsI, * pSimsC; int i, k;
    for ( i = 0; i < iPat; i++ )
    {
        for ( k = 0; k < nLits; k++ )
        {
            int iVar = Abc_Lit2Var( pLits[k] );
            pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
            pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
            if ( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k])) )
                break;
        }
        if ( k == nLits )
            break;
    }
    for ( k = 0; k < nLits; k++ )
    {
        int iVar = Abc_Lit2Var( pLits[k] );
        pSimsI = Vec_WrdEntryP( vSimsIn,   nWords * iVar );
        pSimsC = Vec_WrdEntryP( vSimsCare, nWords * iVar );
        if ( !Abc_TtGetBit(pSimsC, i) && Abc_TtGetBit(pSimsI, i) == Abc_LitIsCompl(pLits[k]) )
            Abc_TtXorBit( pSimsI, i );
        Abc_TtSetBit( pSimsC, i );
        assert( Abc_TtGetBit(pSimsC, i) && (Abc_TtGetBit(pSimsI, i) != Abc_LitIsCompl(pLits[k])) );
    }
    return (int)(i == iPat);
}